

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O3

int __thiscall CSnapshot::Crc(CSnapshot *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  CSnapshot *pCVar7;
  
  uVar3 = (ulong)this->m_NumItems;
  if (0 < (long)uVar3) {
    uVar5 = 0;
    iVar2 = 0;
    do {
      iVar1 = ((CSnapshot *)(&this[1].m_NumItems + uVar3 + uVar5))[-1].m_NumItems;
      pCVar7 = (CSnapshot *)(&this[1].m_NumItems + uVar3 + uVar5);
      if (uVar5 == this->m_NumItems - 1) {
        pCVar7 = this;
      }
      uVar6 = (pCVar7->m_DataSize - iVar1) - 4;
      if (3 < (int)uVar6) {
        uVar4 = 0;
        do {
          iVar2 = iVar2 + *(int *)((long)&(this + 1)[uVar3].m_NumItems + uVar4 * 4 + (long)iVar1);
          uVar4 = uVar4 + 1;
        } while (uVar6 >> 2 != uVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar3);
    return iVar2;
  }
  return 0;
}

Assistant:

int CSnapshot::Crc() const
{
	int Crc = 0;

	for(int i = 0; i < m_NumItems; i++)
	{
		const CSnapshotItem *pItem = GetItem(i);
		int Size = GetItemSize(i);

		for(int b = 0; b < Size/4; b++)
			Crc += pItem->Data()[b];
	}
	return Crc;
}